

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O0

TRIPLERGB ** YCbCr2RGB(TRIPLERGB **mrxY,TRIPLERGB **mrxCb,TRIPLERGB **mrxCr,int h,int w)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  TRIPLERGB **ppTVar7;
  TRIPLERGB *pTVar8;
  double dVar9;
  int local_68;
  uchar local_64;
  int local_60;
  uchar local_5c;
  int local_58;
  uchar local_54;
  int B;
  int G;
  int R;
  u_char Cr;
  u_char Cb;
  u_char Y;
  size_t j;
  size_t i;
  TRIPLERGB **mrxRGBrec;
  int w_local;
  int h_local;
  TRIPLERGB **mrxCr_local;
  TRIPLERGB **mrxCb_local;
  TRIPLERGB **mrxY_local;
  
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)h;
  uVar6 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  ppTVar7 = (TRIPLERGB **)operator_new__(uVar6);
  for (j = 0; j < (ulong)(long)h; j = j + 1) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)w;
    uVar6 = SUB168(auVar5 * ZEXT816(3),0);
    if (SUB168(auVar5 * ZEXT816(3),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    pTVar8 = (TRIPLERGB *)operator_new__(uVar6);
    ppTVar7[j] = pTVar8;
    for (_R = 0; _R < (ulong)(long)w; _R = _R + 1) {
      bVar1 = mrxY[j][_R].red;
      bVar2 = mrxCb[j][_R].red;
      bVar3 = mrxCr[j][_R].red;
      dVar9 = round((double)(int)(bVar3 - 0x80) * 1.402 + (double)bVar1);
      local_58 = (int)dVar9;
      dVar9 = round((double)(int)(bVar2 - 0x80) * -0.334 +
                    (double)(int)(bVar3 - 0x80) * -0.714 + (double)bVar1);
      local_60 = (int)dVar9;
      dVar9 = round((double)(int)(bVar2 - 0x80) * 1.772 + (double)bVar1);
      local_68 = (int)dVar9;
      if (local_58 < 0x100) {
        if (local_58 < 0) {
          local_58 = 0;
        }
        local_54 = (uchar)local_58;
      }
      else {
        local_54 = 0xff;
      }
      if (local_60 < 0x100) {
        if (local_60 < 0) {
          local_60 = 0;
        }
        local_5c = (uchar)local_60;
      }
      else {
        local_5c = 0xff;
      }
      if (local_68 < 0x100) {
        if (local_68 < 0) {
          local_68 = 0;
        }
        local_64 = (uchar)local_68;
      }
      else {
        local_64 = 0xff;
      }
      ppTVar7[j][_R].red = local_54;
      ppTVar7[j][_R].green = local_5c;
      ppTVar7[j][_R].blue = local_64;
    }
  }
  return ppTVar7;
}

Assistant:

TRIPLERGB **YCbCr2RGB(TRIPLERGB **mrxY, TRIPLERGB **mrxCb, TRIPLERGB **mrxCr, int h, int w) {
    TRIPLERGB **mrxRGBrec = new TRIPLERGB *[h];
    for (size_t i = 0; i < h; i++) {
        mrxRGBrec[i] = new TRIPLERGB[w];
        for (size_t j = 0; j < w; j++) {
            u_char Y = mrxY[i][j].red;
            u_char Cb = mrxCb[i][j].red;
            u_char Cr = mrxCr[i][j].red;
            int R = (int) round(Y + 1.402 * (Cr - 128));
            int G = (int) round(Y - 0.714 * (Cr - 128) - 0.334 * (Cb - 128));
            int B = (int) round(Y + 1.772 * (Cb - 128));
            R = (R > 255) ? 255 : ((R < 0) ? 0 : R);
            G = (G > 255) ? 255 : ((G < 0) ? 0 : G);
            B = (B > 255) ? 255 : ((B < 0) ? 0 : B);
            mrxRGBrec[i][j].red = (u_char) R;
            mrxRGBrec[i][j].green = (u_char) G;
            mrxRGBrec[i][j].blue = (u_char) B;
        }
    }
    return mrxRGBrec;
}